

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImGuiWindow *in_RDI;
  ImGuiWindow *display_front_window;
  ImGuiWindow *focus_front_window;
  ImGuiContext *g;
  ImGuiWindow *local_38;
  ImGuiWindow *local_30;
  ImGuiID local_24;
  undefined8 in_stack_ffffffffffffffe8;
  ImGuiContext *ref_window;
  
  ref_window = GImGui;
  if (GImGui->NavWindow != in_RDI) {
    GImGui->NavWindow = in_RDI;
    if ((in_RDI != (ImGuiWindow *)0x0) && ((ref_window->NavDisableMouseHover & 1U) != 0)) {
      ref_window->NavMousePosDirty = true;
    }
    ref_window->NavInitRequest = false;
    if (in_RDI == (ImGuiWindow *)0x0) {
      local_24 = 0;
    }
    else {
      local_24 = in_RDI->NavLastIds[0];
    }
    ref_window->NavId = local_24;
    ref_window->NavFocusScopeId = 0;
    ref_window->NavIdIsAlive = false;
    ref_window->NavLayer = ImGuiNavLayer_Main;
  }
  ClosePopupsOverWindow((ImGuiWindow *)ref_window,SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x38,0))
  ;
  if (in_RDI == (ImGuiWindow *)0x0) {
    local_30 = (ImGuiWindow *)0x0;
    local_38 = (ImGuiWindow *)0x0;
  }
  else {
    local_30 = in_RDI->RootWindow;
    local_38 = in_RDI->RootWindow;
  }
  if ((((ref_window->ActiveId != 0) && (ref_window->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
      (ref_window->ActiveIdWindow->RootWindow != local_30)) &&
     ((ref_window->ActiveIdNoClearOnFocusLoss & 1U) == 0)) {
    ClearActiveID();
  }
  if ((in_RDI != (ImGuiWindow *)0x0) &&
     (BringWindowToFocusFront(local_38), ((in_RDI->Flags | local_38->Flags) & 0x2000U) == 0)) {
    BringWindowToDisplayFront((ImGuiWindow *)ref_window);
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    if (g.NavWindow != window)
    {
        g.NavWindow = window;
        if (window && g.NavDisableMouseHover)
            g.NavMousePosDirty = true;
        g.NavInitRequest = false;
        g.NavId = window ? window->NavLastIds[0] : 0; // Restore NavId
        g.NavFocusScopeId = 0;
        g.NavIdIsAlive = false;
        g.NavLayer = ImGuiNavLayer_Main;
        //IMGUI_DEBUG_LOG("FocusWindow(\"%s\")\n", window ? window->Name : NULL);
    }

    // Close popups if any
    ClosePopupsOverWindow(window, false);

    // Move the root window to the top of the pile
    IM_ASSERT(window == NULL || window->RootWindow != NULL);
    ImGuiWindow* focus_front_window = window ? window->RootWindow : NULL; // NB: In docking branch this is window->RootWindowDockStop
    ImGuiWindow* display_front_window = window ? window->RootWindow : NULL;

    // Steal active widgets. Some of the cases it triggers includes:
    // - Focus a window while an InputText in another window is active, if focus happens before the old InputText can run.
    // - When using Nav to activate menu items (due to timing of activating on press->new window appears->losing ActiveId)
    if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != focus_front_window)
        if (!g.ActiveIdNoClearOnFocusLoss)
            ClearActiveID();

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // Bring to front
    BringWindowToFocusFront(focus_front_window);
    if (((window->Flags | display_front_window->Flags) & ImGuiWindowFlags_NoBringToFrontOnFocus) == 0)
        BringWindowToDisplayFront(display_front_window);
}